

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

Symbols * Preprocessor::macroExpandIdentifier
                    (Symbols *__return_storage_ptr__,Preprocessor *that,SymbolStack *symbols,
                    int lineNum,QByteArray *macroName)

{
  qsizetype *pqVar1;
  SafeSymbols *pSVar2;
  undefined8 uVar3;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *this;
  QArrayData *pQVar4;
  QArrayData *pQVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Data *pDVar9;
  qsizetype qVar10;
  Token TVar11;
  const_iterator cVar12;
  iterator iVar13;
  iterator iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  Symbol *pSVar19;
  QArrayDataPointer<Symbol> *pQVar20;
  long lVar21;
  qsizetype *pqVar22;
  char *msg;
  long lVar23;
  SafeSymbols *pSVar24;
  Symbol *pSVar25;
  char cVar26;
  undefined1 *puVar27;
  long in_FS_OFFSET;
  bool bVar28;
  Bucket BVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  qsizetype idx;
  Symbol s;
  Symbol next;
  QVarLengthArray<QList<Symbol>,_5LL> arguments;
  QArrayData *local_288;
  char *pcStack_280;
  qsizetype local_278;
  QArrayData *local_268;
  SafeSymbols *pSStack_260;
  char *local_258;
  Symbol local_248;
  QByteArray local_218;
  value_type local_1f8;
  QArrayDataPointer<Symbol> local_1c8;
  Macro local_1b0;
  QArrayData *local_178 [3];
  SubArray local_160;
  Symbol local_138;
  value_type local_108;
  Symbol local_c8 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
  lVar15 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
  pSVar25 = pSVar2[lVar15 + -1].symbols.d.ptr;
  lVar15 = pSVar2[lVar15 + -1].index;
  uVar3._0_4_ = pSVar25[lVar15 + -1].lineNum;
  uVar3._4_4_ = pSVar25[lVar15 + -1].token;
  local_138.lex.d.d = pSVar25[lVar15 + -1].lex.d.d;
  local_138.lex.d.ptr = pSVar25[lVar15 + -1].lex.d.ptr;
  local_138.lex.d.size = pSVar25[lVar15 + -1].lex.d.size;
  if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138.from = pSVar25[lVar15 + -1].from;
  local_138.len = pSVar25[lVar15 + -1].len;
  bVar28 = true;
  local_138._0_8_ = uVar3;
  if (uVar3._4_4_ == IDENTIFIER) {
    if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this = (that->macros).d;
    local_160.array.d.d = local_138.lex.d.d;
    local_160.array.d.ptr = local_138.lex.d.ptr;
    local_160.array.d.size = local_138.lex.d.size;
    local_160.from = local_138.from;
    local_160.len = local_138.len;
    if (this == (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) goto LAB_001319cc;
    BVar29 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
                       (this,&local_160);
    if (((BVar29.span)->offsets[BVar29.index] == 0xff) || ((BVar29.span)->entries == (Entry *)0x0))
    {
      bVar7 = false;
    }
    else {
      QByteArray::mid((longlong)local_178,(longlong)&local_138.lex);
      pSVar2 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
      pSVar24 = pSVar2 + (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
      cVar12 = std::
               __find_if<QList<SafeSymbols>::const_iterator,__gnu_cxx::__ops::_Iter_pred<SymbolStack::dontReplaceSymbol(QByteArray_const&)const::_lambda(SafeSymbols_const&)_1_>>
                         (pSVar2,pSVar24,local_178);
      bVar28 = cVar12.i != pSVar24;
      bVar7 = true;
    }
  }
  else {
LAB_001319cc:
    bVar7 = false;
  }
  if ((bVar7) && (local_178[0] != (QArrayData *)0x0)) {
    LOCK();
    (local_178[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_178[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_178[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_178[0],1,0x10);
    }
  }
  if ((uVar3._4_4_ == IDENTIFIER) && (&(local_160.array.d.d)->super_QArrayData != (QArrayData *)0x0)
     ) {
    LOCK();
    ((local_160.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_160.array.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar28) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (Symbol *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_00132add;
  }
  local_c8[0]._0_8_ = local_138.lex.d.d;
  local_c8[0].lex.d.d = (Data *)local_138.lex.d.ptr;
  local_c8[0].lex.d.ptr = (char *)local_138.lex.d.size;
  if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8[0].lex.d.size = local_138.from;
  local_c8[0].from = local_138.len;
  QHash<SubArray,_Macro>::value(&local_1b0,&that->macros,(SubArray *)local_c8);
  if ((QArrayData *)local_c8[0]._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8[0]._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8[0]._0_8_,1,0x10);
    }
  }
  QByteArray::mid((longlong)local_c8,(longlong)&local_138.lex);
  pQVar4 = &((macroName->d).d)->super_QArrayData;
  pQVar5 = (QArrayData *)(macroName->d).ptr;
  (macroName->d).d = (Data *)local_c8[0]._0_8_;
  (macroName->d).ptr = (char *)local_c8[0].lex.d.d;
  pQVar20 = (QArrayDataPointer<Symbol> *)(macroName->d).size;
  (macroName->d).size = (qsizetype)local_c8[0].lex.d.ptr;
  local_c8[0]._0_8_ = pQVar4;
  local_c8[0].lex.d.d = (Data *)pQVar5;
  local_c8[0].lex.d.ptr = (char *)pQVar20;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
  }
  local_1c8.d = (Data *)0x0;
  local_1c8.ptr = (Symbol *)0x0;
  local_1c8.size = 0;
  if (local_1b0.isFunction == true) {
    bVar28 = false;
    do {
      pSVar2 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
      lVar15 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
      pqVar22 = &pSVar2[lVar15 + -1].index;
      do {
        lVar21 = lVar15;
        if (lVar21 < 1) {
          lVar15 = -1;
          break;
        }
        lVar15 = lVar21 + -1;
        lVar16 = *pqVar22;
        pqVar1 = pqVar22 + -5;
        pqVar22 = pqVar22 + -8;
      } while (*pqVar1 <= lVar16);
      if ((lVar21 < 1) ||
         (pSVar2[lVar15].symbols.d.ptr[pSVar2[lVar15].index].token != PP_WHITESPACE))
      goto LAB_00131bfe;
      SymbolStack::next(symbols);
      bVar28 = true;
    } while( true );
  }
  QArrayDataPointer<Symbol>::operator=(&local_1c8,&local_1b0.symbols.d);
  goto LAB_00132a86;
LAB_00131bfe:
  pSVar2 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
  lVar15 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
  pqVar22 = &pSVar2[lVar15 + -1].index;
  do {
    lVar21 = lVar15;
    if (lVar21 < 1) {
      lVar15 = -1;
      break;
    }
    lVar15 = lVar21 + -1;
    lVar16 = *pqVar22;
    pqVar1 = pqVar22 + -5;
    pqVar22 = pqVar22 + -8;
  } while (*pqVar1 <= lVar16);
  if ((lVar21 < 1) || (pSVar2[lVar15].symbols.d.ptr[pSVar2[lVar15].index].token != LPAREN)) {
    bVar7 = false;
  }
  else {
    SymbolStack::next(symbols);
    bVar7 = true;
  }
  if (bVar7) {
    memset(local_c8,0xaa,0x90);
    local_c8[0]._0_8_ = &DAT_00000005;
    local_c8[0].lex.d.d = (Data *)0x0;
    local_c8[0].lex.d.ptr = (char *)&local_c8[0].lex.d.size;
LAB_00131ccc:
    if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0) {
      iVar13 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
      lVar15 = iVar13.i[-1].index;
      iVar13 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
      if (iVar13.i[-1].symbols.d.size <= lVar15) {
        QList<SafeSymbols>::takeLast(&local_108,(QList<SafeSymbols> *)symbols);
        QHash<QByteArray,_QHashDummyValue>::~QHash(&local_108.excludedSymbols.q_hash);
        if ((Symbol *)local_108.expandedMacro.d.d != (Symbol *)0x0) {
          LOCK();
          *(int *)&(local_108.expandedMacro.d.d)->super_QArrayData =
               *(int *)&(local_108.expandedMacro.d.d)->super_QArrayData + -1;
          UNLOCK();
          if (*(int *)&(local_108.expandedMacro.d.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_108.expandedMacro.d.d)->super_QArrayData,1,0x10);
          }
        }
        QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108);
        goto LAB_00131ccc;
      }
    }
    if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0) {
      local_1f8._0_8_ = (Symbol *)0x0;
      local_1f8.lex.d.d = (Data *)0x0;
      local_1f8.lex.d.ptr = (char *)0x0;
      do {
        pSVar2 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
        lVar15 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
        pqVar22 = &pSVar2[lVar15 + -1].index;
        do {
          lVar21 = lVar15;
          if (lVar21 < 1) {
            lVar15 = -1;
            break;
          }
          lVar15 = lVar21 + -1;
          lVar16 = *pqVar22;
          pqVar1 = pqVar22 + -5;
          pqVar22 = pqVar22 + -8;
        } while (*pqVar1 <= lVar16);
        if ((lVar21 < 1) ||
           (pSVar2[lVar15].symbols.d.ptr[pSVar2[lVar15].index].token != PP_WHITESPACE))
        goto LAB_00131dc0;
        SymbolStack::next(symbols);
      } while( true );
    }
    goto LAB_00132101;
  }
  pQVar4 = &((macroName->d).d)->super_QArrayData;
  (macroName->d).d = (Data *)0x0;
  (macroName->d).ptr = (char *)0x0;
  (macroName->d).size = 0;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Symbol *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (bVar28) {
    local_c8[0].token = 0xa5;
    local_c8[0].lineNum = lineNum;
    local_c8[0].lex.d.d = (Data *)0x0;
    local_c8[0].lex.d.ptr = (char *)0x0;
    local_c8[0].lex.d.size = 0;
    local_c8[0].from = 0;
    local_c8[0].len = -1;
    QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
              ((QMovableArrayOps<Symbol> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               local_c8);
    QList<Symbol>::end(__return_storage_ptr__);
    if (&(local_c8[0].lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8[0].lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8[0].lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8[0].lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_c8[0].lex.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
            ((QMovableArrayOps<Symbol> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             &local_138);
  QList<Symbol>::end(__return_storage_ptr__);
  iVar14 = QList<Symbol>::end(__return_storage_ptr__);
  iVar14.i[-1].lineNum = lineNum;
  goto LAB_00132a81;
LAB_00131dc0:
  iVar18 = 0;
  bVar28 = false;
  if (local_1b0.isVariadic == true) {
    bVar28 = &(local_c8[0].lex.d.d)->super_QArrayData ==
             (QArrayData *)(local_1b0.arguments.d.size + -1);
  }
LAB_00131de9:
  do {
    if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0) {
      iVar13 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
      lVar15 = iVar13.i[-1].index;
      iVar13 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
      if (iVar13.i[-1].symbols.d.size <= lVar15) {
        QList<SafeSymbols>::takeLast(&local_108,(QList<SafeSymbols> *)symbols);
        QHash<QByteArray,_QHashDummyValue>::~QHash(&local_108.excludedSymbols.q_hash);
        if ((Symbol *)local_108.expandedMacro.d.d != (Symbol *)0x0) {
          LOCK();
          *(int *)&(local_108.expandedMacro.d.d)->super_QArrayData =
               *(int *)&(local_108.expandedMacro.d.d)->super_QArrayData + -1;
          UNLOCK();
          if (*(int *)&(local_108.expandedMacro.d.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_108.expandedMacro.d.d)->super_QArrayData,1,0x10);
          }
        }
        QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108);
        goto LAB_00131de9;
      }
    }
    if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size == 0) break;
    TVar11 = SymbolStack::next(symbols);
    if (TVar11 == PP_RPAREN) {
      iVar17 = iVar18 + -1;
      if (0 < iVar18) goto LAB_00131e99;
      bVar8 = false;
      iVar18 = iVar17;
    }
    else {
      if (TVar11 == LPAREN) {
        iVar17 = iVar18 + 1;
      }
      else {
        bVar6 = iVar18 != 0;
        bVar8 = false;
        iVar17 = iVar18;
        iVar18 = 0;
        if (!(bool)((TVar11 != COMMA || bVar6) | bVar28)) goto LAB_00131ee3;
      }
LAB_00131e99:
      pSVar2 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
      lVar15 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                ((QMovableArrayOps<Symbol> *)&local_1f8,(qsizetype)local_1f8.lex.d.ptr,
                 pSVar2[lVar15 + -1].symbols.d.ptr + pSVar2[lVar15 + -1].index + -1);
      QList<Symbol>::end((QList<Symbol> *)&local_1f8);
      bVar8 = true;
      iVar18 = iVar17;
    }
LAB_00131ee3:
  } while (bVar8);
  if (local_c8[0].lex.d.d == (Data *)local_c8[0]._0_8_) {
    local_108.symbols.d.d = (Data *)local_1f8._0_8_;
    local_108.symbols.d.ptr = (Symbol *)local_1f8.lex.d.d;
    local_108.symbols.d.size = (qsizetype)local_1f8.lex.d.ptr;
    if ((Symbol *)local_1f8._0_8_ != (Symbol *)0x0) {
      LOCK();
      (((QArrayData *)local_1f8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1f8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVLABase<QList<Symbol>>::emplace_back_impl<QList<Symbol>>
              ((QVLABase<QList<Symbol>> *)local_c8,5,&local_c8[0].lex.d.size,&local_108.symbols);
    QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108);
  }
  else {
    QVLABase<QList<Symbol>>::emplace_back_impl<QList<Symbol>const&>
              ((QVLABase<QList<Symbol>> *)local_c8,5,&local_c8[0].lex.d.size,
               (QList<Symbol> *)&local_1f8);
  }
  if (iVar18 < 0) {
    QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_1f8);
    goto LAB_00132101;
  }
  while ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0) {
    iVar13 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
    lVar15 = iVar13.i[-1].index;
    iVar13 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
    if (lVar15 < iVar13.i[-1].symbols.d.size) break;
    QList<SafeSymbols>::takeLast(&local_108,(QList<SafeSymbols> *)symbols);
    QHash<QByteArray,_QHashDummyValue>::~QHash(&local_108.excludedSymbols.q_hash);
    if ((Symbol *)local_108.expandedMacro.d.d != (Symbol *)0x0) {
      LOCK();
      *(int *)&(local_108.expandedMacro.d.d)->super_QArrayData =
           *(int *)&(local_108.expandedMacro.d.d)->super_QArrayData + -1;
      UNLOCK();
      if (*(int *)&(local_108.expandedMacro.d.d)->super_QArrayData == 0) {
        QArrayData::deallocate(&(local_108.expandedMacro.d.d)->super_QArrayData,1,0x10);
      }
    }
    QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108);
  }
  if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size == 0) {
    msg = "missing \')\' in macro usage";
    goto LAB_00132b35;
  }
  QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_1f8);
  if (iVar18 < 0) goto LAB_00132101;
  goto LAB_00131ccc;
LAB_00132101:
  if ((local_1b0.isVariadic == true) &&
     (&(local_c8[0].lex.d.d)->super_QArrayData == (QArrayData *)(local_1b0.arguments.d.size + -1)))
  {
    local_108.symbols.d.d = (Data *)0x0;
    local_108.symbols.d.ptr = (Symbol *)0x0;
    local_108.symbols.d.size = 0;
    QVLABase<QList<Symbol>>::emplace_back_impl<QList<Symbol>>
              ((QVLABase<QList<Symbol>> *)local_c8,5,&local_c8[0].lex.d.size,&local_108.symbols);
    QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108);
  }
  if (local_1b0.symbols.d.size != 0) {
    cVar26 = '\0';
    pSVar25 = local_1b0.symbols.d.ptr;
    do {
      TVar11 = pSVar25->token;
      if ((TVar11 == PP_HASHHASH) || (TVar11 == HASH)) {
        cVar26 = (TVar11 != HASH) + '\x01';
      }
      else {
        if (local_1b0.arguments.d.size == 0) {
LAB_00132237:
          lVar23 = -1;
        }
        else {
          lVar15 = local_1b0.arguments.d.size * 0x30;
          pSVar19 = local_1b0.arguments.d.ptr;
          lVar21 = 0x30 - (long)local_1b0.arguments.d.ptr;
          do {
            lVar23 = lVar21;
            lVar16 = lVar15;
            if (lVar16 == 0) goto LAB_0013222d;
            bVar28 = Symbol::operator==(pSVar19,pSVar25);
            pSVar19 = pSVar19 + 1;
            lVar15 = lVar16 + -0x30;
            lVar21 = lVar23 + -0x30;
          } while (!bVar28);
          lVar23 = (-((long)&local_1b0.arguments.d.ptr[-1].lineNum + lVar23) >> 4) *
                   -0x5555555555555555;
LAB_0013222d:
          if (lVar16 == 0) goto LAB_00132237;
        }
        if (cVar26 == '\x01') {
          if (lVar23 < 0) {
            msg = "\'#\' is not followed by a macro parameter";
            goto LAB_00132b35;
          }
          if ((long)local_c8[0].lex.d.d <= lVar23) {
            msg = "Macro invoked with too few parameters for a use of \'#\'";
            goto LAB_00132b35;
          }
          local_1f8._0_8_ = (Symbol *)0x0;
          local_1f8.lex.d.d = (Data *)0x0;
          local_1f8.lex.d.ptr = (char *)0x0;
          lVar15 = ((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->
                   size;
          if (lVar15 != 0) {
            pSVar19 = ((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->
                      ptr;
            lVar21 = 0;
            do {
              QByteArray::mid((longlong)&local_108,(long)&(pSVar19->lex).d.d + lVar21);
              QByteArray::append((QByteArray *)&local_1f8);
              if ((Symbol *)local_108.symbols.d.d != (Symbol *)0x0) {
                LOCK();
                *(int *)&(local_108.symbols.d.d)->super_QArrayData =
                     *(int *)&(local_108.symbols.d.d)->super_QArrayData + -1;
                UNLOCK();
                if (*(int *)&(local_108.symbols.d.d)->super_QArrayData == 0) {
                  QArrayData::deallocate(&(local_108.symbols.d.d)->super_QArrayData,1,0x10);
                }
              }
              lVar21 = lVar21 + 0x30;
            } while (lVar15 * 0x30 != lVar21);
          }
          local_108.symbols.d.d._0_1_ = 0x22;
          QVar30.m_data = (storage_type *)0x1;
          QVar30.m_size = (qsizetype)&local_1f8;
          QVar31.m_data = (storage_type *)0x2;
          QVar31.m_size = (qsizetype)&local_108;
          QByteArray::replace(QVar30,QVar31);
          local_108.symbols.d.d = (Data *)CONCAT71(local_108.symbols.d.d._1_7_,0x22);
          QByteArray::insert((longlong)&local_1f8,(QByteArrayView)(ZEXT816(1) << 0x40));
          QByteArray::append((char)&local_1f8);
          local_108.symbols.d.d = (Data *)CONCAT44(4,lineNum);
          local_108.symbols.d.ptr = (Symbol *)local_1f8._0_8_;
          local_108.symbols.d.size = (qsizetype)local_1f8.lex.d.d;
          local_108.expandedMacro.d.d = (Data *)local_1f8.lex.d.ptr;
          if ((Symbol *)local_1f8._0_8_ != (Symbol *)0x0) {
            LOCK();
            *(int *)local_1f8._0_8_ = *(int *)local_1f8._0_8_ + 1;
            UNLOCK();
          }
          local_108.expandedMacro.d.ptr = (char *)0x0;
          local_108.expandedMacro.d.size = (qsizetype)local_1f8.lex.d.ptr;
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                    ((QMovableArrayOps<Symbol> *)&local_1c8,local_1c8.size,(Symbol *)&local_108);
          QList<Symbol>::end((QList<Symbol> *)&local_1c8);
          if (local_108.symbols.d.ptr != (Symbol *)0x0) {
            LOCK();
            (local_108.symbols.d.ptr)->lineNum = (local_108.symbols.d.ptr)->lineNum + -1;
            UNLOCK();
            if ((local_108.symbols.d.ptr)->lineNum == 0) {
              QArrayData::deallocate((QArrayData *)local_108.symbols.d.ptr,1,0x10);
            }
          }
          if ((Symbol *)local_1f8._0_8_ != (Symbol *)0x0) {
            LOCK();
            *(int *)local_1f8._0_8_ = *(int *)local_1f8._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_1f8._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_1f8._0_8_,1,0x10);
            }
          }
        }
        else {
          if (cVar26 != '\0') {
            cVar26 = '\x02';
            if (pSVar25->token == PP_WHITESPACE) goto LAB_00132a0a;
            while ((local_1c8.size != 0 &&
                   (local_1c8.ptr[local_1c8.size + -1].token == PP_WHITESPACE))) {
              QList<Symbol>::pop_back((QList<Symbol> *)&local_1c8);
            }
            local_108.symbols.d.d = *(Data **)pSVar25;
            local_108.symbols.d.ptr = (Symbol *)(pSVar25->lex).d.d;
            local_108.symbols.d.size = (qsizetype)(pSVar25->lex).d.ptr;
            local_108.expandedMacro.d.d = (Data *)(pSVar25->lex).d.size;
            if (local_108.symbols.d.ptr != (Symbol *)0x0) {
              LOCK();
              (local_108.symbols.d.ptr)->lineNum = (local_108.symbols.d.ptr)->lineNum + 1;
              UNLOCK();
            }
            local_108.expandedMacro.d.ptr = (char *)pSVar25->from;
            local_108.expandedMacro.d.size = pSVar25->len;
            if ((lVar23 < 0) || ((long)local_c8[0].lex.d.d <= lVar23)) {
LAB_001326ea:
              cVar26 = '\x02';
              if (((local_1c8.size == 0) ||
                  (local_1c8.ptr[local_1c8.size + -1].token == PP_STRING_LITERAL)) ||
                 (local_1c8.ptr[local_1c8.size + -1].token != pSVar25->token)) {
                QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                          ((QMovableArrayOps<Symbol> *)&local_1c8,local_1c8.size,
                           (Symbol *)&local_108);
                QList<Symbol>::end((QList<Symbol> *)&local_1c8);
              }
              else {
                local_1f8.from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_1f8.len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_1f8.lex.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                local_1f8.lex.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_1f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_1f8.lex.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                QList<Symbol>::takeLast(&local_1f8,(QList<Symbol> *)&local_1c8);
                local_218.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_218.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_218.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                QByteArray::mid((longlong)&local_268,(longlong)&local_1f8.lex);
                QByteArray::mid((longlong)&local_288,(longlong)&local_108.symbols.d.ptr);
                local_248.lex.d.ptr = local_258;
                local_248.lex.d.d = (Data *)pSStack_260;
                local_248._0_8_ = local_268;
                local_248.len = local_278;
                local_248.from = (qsizetype)pcStack_280;
                local_248.lex.d.size = (qsizetype)local_288;
                local_268 = (QArrayData *)0x0;
                pSStack_260 = (SafeSymbols *)0x0;
                local_258 = (char *)0x0;
                local_288 = (QArrayData *)0x0;
                pcStack_280 = (char *)0x0;
                local_278 = 0;
                QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>
                          (&local_218,(QStringBuilder<QByteArray,_QByteArray> *)&local_248);
                QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
                          ((QStringBuilder<QByteArray,_QByteArray> *)&local_248);
                if (local_288 != (QArrayData *)0x0) {
                  LOCK();
                  (local_288->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_288->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_288->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_288,1,0x10);
                  }
                }
                if (local_268 != (QArrayData *)0x0) {
                  LOCK();
                  (local_268->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_268->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_268->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_268,1,0x10);
                  }
                }
                local_248.token = local_1f8.token;
                local_248.lineNum = lineNum;
                local_248.lex.d.d = local_218.d.d;
                local_248.lex.d.ptr = local_218.d.ptr;
                local_248.lex.d.size = local_218.d.size;
                if ((SafeSymbols *)local_218.d.d != (SafeSymbols *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((Symbols *)&(local_218.d.d)->super_QArrayData)->d).d)->
                  _M_i = ((__atomic_base<int> *)
                         &(((Symbols *)&(local_218.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                  UNLOCK();
                }
                local_248.from = 0;
                local_248.len = local_218.d.size;
                QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                          ((QMovableArrayOps<Symbol> *)&local_1c8,local_1c8.size,&local_248);
                QList<Symbol>::end((QList<Symbol> *)&local_1c8);
                if ((SafeSymbols *)local_248.lex.d.d != (SafeSymbols *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((Symbols *)&(local_248.lex.d.d)->super_QArrayData)->d).d
                  )->_M_i = ((__atomic_base<int> *)
                            &(((Symbols *)&(local_248.lex.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)
                      &(((Symbols *)&(local_248.lex.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                    QArrayData::deallocate(&(local_248.lex.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if ((SafeSymbols *)local_218.d.d != (SafeSymbols *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((Symbols *)&(local_218.d.d)->super_QArrayData)->d).d)->
                  _M_i = ((__atomic_base<int> *)
                         &(((Symbols *)&(local_218.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((Symbols *)&(local_218.d.d)->super_QArrayData)->d).d
                      )->_M_i == 0) {
                    QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if ((Symbol *)local_1f8.lex.d.d != (Symbol *)0x0) {
                  LOCK();
                  *(int *)&(local_1f8.lex.d.d)->super_QArrayData =
                       *(int *)&(local_1f8.lex.d.d)->super_QArrayData + -1;
                  UNLOCK();
                  if (*(int *)&(local_1f8.lex.d.d)->super_QArrayData == 0) {
                    QArrayData::deallocate(&(local_1f8.lex.d.d)->super_QArrayData,1,0x10);
                  }
                }
              }
              iVar17 = 0;
              iVar18 = 0;
              if (((-1 < lVar23) && (iVar18 = iVar17, lVar23 < (long)local_c8[0].lex.d.d)) &&
                 (((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->size
                  != 0)) {
                QtPrivate::QCommonArrayOps<Symbol>::growAppend
                          ((QCommonArrayOps<Symbol> *)&local_1c8,
                           ((QArrayDataPointer<Symbol> *)
                           ((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->ptr + 1,
                           ((QArrayDataPointer<Symbol> *)
                           ((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->ptr +
                           ((QArrayDataPointer<Symbol> *)
                           ((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->size);
              }
            }
            else {
              if (((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->size
                  != 0) {
                pSVar19 = ((QArrayDataPointer<Symbol> *)
                          ((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->ptr;
                local_108.symbols.d.d = *(Data **)pSVar19;
                QByteArray::operator=((QByteArray *)&local_108.symbols.d.ptr,&pSVar19->lex);
                local_108.expandedMacro.d.ptr = (char *)pSVar19->from;
                local_108.expandedMacro.d.size = pSVar19->len;
                goto LAB_001326ea;
              }
              cVar26 = '\0';
              iVar18 = 0xc;
            }
            if (local_108.symbols.d.ptr != (Symbol *)0x0) {
              LOCK();
              (local_108.symbols.d.ptr)->lineNum = (local_108.symbols.d.ptr)->lineNum + -1;
              UNLOCK();
              if ((local_108.symbols.d.ptr)->lineNum == 0) {
                QArrayData::deallocate((QArrayData *)local_108.symbols.d.ptr,1,0x10);
              }
            }
            if (iVar18 == 0) {
              cVar26 = '\0';
            }
            goto LAB_00132a0a;
          }
          if ((lVar23 < 0) || ((long)local_c8[0].lex.d.d <= lVar23)) {
            QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                      ((QMovableArrayOps<Symbol> *)&local_1c8,local_1c8.size,pSVar25);
            QList<Symbol>::end((QList<Symbol> *)&local_1c8);
          }
          else {
            if ((pSVar25 ==
                 local_1b0.symbols.d.ptr + local_1b0.symbols.d.size +
                 -(ulong)(local_1b0.symbols.d.size != 0)) || (pSVar25[1].token != PP_HASHHASH)) {
              local_108.symbols.d.d =
                   ((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->d;
              local_108.symbols.d.ptr =
                   ((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->ptr
              ;
              local_108.symbols.d.size =
                   ((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->
                   size;
              if ((Symbol *)local_108.symbols.d.d != (Symbol *)0x0) {
                LOCK();
                (((QArrayData *)&((Symbol *)local_108.symbols.d.d)->lineNum)->ref_)._q_value.
                super___atomic_base<int>._M_i =
                     (((QArrayData *)&((Symbol *)local_108.symbols.d.d)->lineNum)->ref_)._q_value.
                     super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_1f8._0_8_ = (Symbol *)0x1;
              SymbolStack::excludeSymbols((SymbolStack *)&local_248);
              cVar26 = '\0';
              macroExpand((Symbols *)&local_1c8,that,&local_108.symbols,(qsizetype *)&local_1f8,
                          lineNum,false,(QSet<QByteArray> *)&local_248);
              QHash<QByteArray,_QHashDummyValue>::~QHash
                        ((QHash<QByteArray,_QHashDummyValue> *)&local_248);
              QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108)
              ;
              goto LAB_00132a0a;
            }
            QtPrivate::QCommonArrayOps<Symbol>::growAppend
                      ((QCommonArrayOps<Symbol> *)&local_1c8,
                       ((QArrayDataPointer<Symbol> *)((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))
                       ->ptr,((QArrayDataPointer<Symbol> *)
                             ((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->ptr +
                             ((QArrayDataPointer<Symbol> *)
                             ((long)local_c8[0].lex.d.ptr + lVar23 * 0x18))->size);
          }
        }
        cVar26 = '\0';
      }
LAB_00132a0a:
      pSVar25 = pSVar25 + 1;
    } while (pSVar25 != local_1b0.symbols.d.ptr + local_1b0.symbols.d.size);
    if (cVar26 != '\0') {
      msg = "\'#\' or \'##\' found at the end of a macro argument";
LAB_00132b35:
      Parser::error(&that->super_Parser,msg);
    }
  }
  if (0 < (long)local_c8[0].lex.d.d) {
    puVar27 = (undefined1 *)
              ((long)&((local_c8[0].lex.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i + 1);
    pQVar20 = (QArrayDataPointer<Symbol> *)local_c8[0].lex.d.ptr;
    do {
      QArrayDataPointer<Symbol>::~QArrayDataPointer(pQVar20);
      pQVar20 = pQVar20 + 1;
      puVar27 = puVar27 + -1;
    } while (1 < (long)puVar27);
  }
  if ((qsizetype *)local_c8[0].lex.d.ptr != &local_c8[0].lex.d.size) {
    QtPrivate::sizedFree(local_c8[0].lex.d.ptr,local_c8[0]._0_8_ * 0x18);
  }
LAB_00132a81:
  if (bVar7) {
LAB_00132a86:
    qVar10 = local_1c8.size;
    pSVar25 = local_1c8.ptr;
    pDVar9 = local_1c8.d;
    local_1c8.d = (Data *)0x0;
    local_1c8.ptr = (Symbol *)0x0;
    (__return_storage_ptr__->d).d = pDVar9;
    (__return_storage_ptr__->d).ptr = pSVar25;
    local_1c8.size = 0;
    (__return_storage_ptr__->d).size = qVar10;
  }
  QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_1c8);
  QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_1b0.symbols.d);
  QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_1b0.arguments.d);
LAB_00132add:
  if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.lex.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Symbols Preprocessor::macroExpandIdentifier(Preprocessor *that, SymbolStack &symbols, int lineNum, QByteArray *macroName)
{
    Symbol s = symbols.symbol();

    // not a macro
    if (s.token != PP_IDENTIFIER || !that->macros.contains(s) || symbols.dontReplaceSymbol(s.lexem())) {
        return Symbols();
    }

    const Macro &macro = that->macros.value(s);
    *macroName = s.lexem();

    Symbols expansion;
    if (!macro.isFunction) {
        expansion = macro.symbols;
    } else {
        bool haveSpace = false;
        while (symbols.test(PP_WHITESPACE)) { haveSpace = true; }
        if (!symbols.test(PP_LPAREN)) {
            *macroName = QByteArray();
            Symbols syms;
            if (haveSpace)
                syms += Symbol(lineNum, PP_WHITESPACE);
            syms += s;
            syms.last().lineNum = lineNum;
            return syms;
        }
        QVarLengthArray<Symbols, 5> arguments;
        while (symbols.hasNext()) {
            Symbols argument;
            // strip leading space
            while (symbols.test(PP_WHITESPACE)) {}
            int nesting = 0;
            bool vararg = macro.isVariadic && (arguments.size() == macro.arguments.size() - 1);
            while (symbols.hasNext()) {
                Token t = symbols.next();
                if (t == PP_LPAREN) {
                    ++nesting;
                } else if (t == PP_RPAREN) {
                    --nesting;
                    if (nesting < 0)
                        break;
                } else if (t == PP_COMMA && nesting == 0) {
                    if (!vararg)
                        break;
                }
                argument += symbols.symbol();
            }
            arguments += argument;

            if (nesting < 0)
                break;
            else if (!symbols.hasNext())
                that->error("missing ')' in macro usage");
        }

        // empty VA_ARGS
        if (macro.isVariadic && arguments.size() == macro.arguments.size() - 1)
            arguments += Symbols();

        // now replace the macro arguments with the expanded arguments
        enum Mode {
            Normal,
            Hash,
            HashHash
        } mode = Normal;

        const auto end = macro.symbols.cend();
        auto it = macro.symbols.cbegin();
        const auto lastSym = std::prev(macro.symbols.cend(), !macro.symbols.isEmpty() ? 1 : 0);
        for (; it != end; ++it) {
            const Symbol &s = *it;
            if (s.token == HASH || s.token == PP_HASHHASH) {
                mode = (s.token == HASH ? Hash : HashHash);
                continue;
            }
            const qsizetype index = macro.arguments.indexOf(s);
            if (mode == Normal) {
                if (index >= 0 && index < arguments.size()) {
                    // each argument undoergoes macro expansion if it's not used as part of a # or ##
                    if (it == lastSym || std::next(it)->token != PP_HASHHASH) {
                        Symbols arg = arguments.at(index);
                        qsizetype idx = 1;
                        macroExpand(&expansion, that, arg, idx, lineNum, false, symbols.excludeSymbols());
                    } else {
                        expansion += arguments.at(index);
                    }
               } else {
                    expansion += s;
                }
            } else if (mode == Hash) {
                if (index < 0) {
                    that->error("'#' is not followed by a macro parameter");
                    continue;
                } else if (index >= arguments.size()) {
                    that->error("Macro invoked with too few parameters for a use of '#'");
                    continue;
                }

                const Symbols &arg = arguments.at(index);
                QByteArray stringified;
                for (const Symbol &sym : arg)
                    stringified += sym.lexem();

                stringified.replace('"', "\\\"");
                stringified.prepend('"');
                stringified.append('"');
                expansion += Symbol(lineNum, STRING_LITERAL, stringified);
            } else if (mode == HashHash){
                if (s.token == WHITESPACE)
                    continue;

                while (expansion.size() && expansion.constLast().token == PP_WHITESPACE)
                    expansion.pop_back();

                Symbol next = s;
                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (arg.size() == 0) {
                        mode = Normal;
                        continue;
                    }
                    next = arg.at(0);
                }

                if (!expansion.isEmpty() && expansion.constLast().token == s.token
                    && expansion.constLast().token != STRING_LITERAL) {
                    Symbol last = expansion.takeLast();

                    QByteArray lexem = last.lexem() + next.lexem();
                    expansion += Symbol(lineNum, last.token, lexem);
                } else {
                    expansion += next;
                }

                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (!arg.isEmpty())
                        expansion.append(arg.cbegin() + 1, arg.cend());
                }
            }
            mode = Normal;
        }
        if (mode != Normal)
            that->error("'#' or '##' found at the end of a macro argument");

    }

    return expansion;
}